

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  MidiEventList *pMVar6;
  MidiEvent *pMVar7;
  ostream *poVar8;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> notes;
  MidiEvent *local_188;
  MidiFile midifile;
  Options options;
  
  smf::Options::Options(&options,argc,argv);
  checkOptions(&options);
  smf::MidiFile::MidiFile(&midifile);
  iVar2 = smf::Options::getArgCount(&options);
  if (iVar2 != 2) {
    iVar2 = smf::Options::getArgCount(&options);
    if (iVar2 != 1) {
      std::operator<<((ostream *)&std::cerr,"Need one optional MIDI file (or standard input), ");
      poVar8 = std::operator<<((ostream *)&std::cerr,"and one output");
      std::endl<char,std::char_traits<char>>(poVar8);
      exit(1);
    }
  }
  psVar5 = smf::Options::getArg_abi_cxx11_(&options,1);
  smf::MidiFile::read(&midifile,(int)psVar5,__buf,in_RCX);
  smf::MidiFile::linkNotePairs(&midifile);
  notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve(&notes,0x1e240);
  iVar2 = 0;
  while( true ) {
    iVar3 = smf::MidiFile::getNumTracks(&midifile);
    if (iVar3 <= iVar2) break;
    iVar3 = 0;
    while( true ) {
      iVar4 = smf::MidiFile::getNumEvents(&midifile,iVar2);
      if (iVar4 <= iVar3) break;
      pMVar6 = smf::MidiFile::operator[](&midifile,iVar2);
      pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar3);
      bVar1 = smf::MidiMessage::isNoteOn(&pMVar7->super_MidiMessage);
      if (bVar1) {
        pMVar6 = smf::MidiFile::operator[](&midifile,iVar2);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar3);
        iVar4 = smf::MidiEvent::isLinked(pMVar7);
        if (iVar4 != 0) {
          pMVar6 = smf::MidiFile::operator[](&midifile,iVar2);
          local_188 = smf::MidiEventList::operator[](pMVar6,iVar3);
          std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
          emplace_back<smf::MidiEvent*>
                    ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)&notes,&local_188);
        }
      }
      iVar3 = iVar3 + 1;
    }
    iVar2 = iVar2 + 1;
  }
  if (reverseQ == 0) {
    randomizeNotes(&notes);
  }
  else {
    reverseNotes(&notes);
  }
  iVar2 = smf::Options::getArgCount(&options);
  psVar5 = smf::Options::getArg_abi_cxx11_(&options,(iVar2 == 2) + 1);
  smf::MidiFile::write(&midifile,(int)psVar5,__buf_00,in_RCX);
  std::_Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~_Vector_base
            (&notes.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>);
  smf::MidiFile::~MidiFile(&midifile);
  smf::Options::~Options(&options);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   Options options(argc, argv);
   checkOptions(options);

   MidiFile midifile;
   if (options.getArgCount() == 2) {
      midifile.read(options.getArg(1));
   } else if (options.getArgCount() == 1) {
      midifile.read(options.getArg(1));
   } else {
      cerr << "Need one optional MIDI file (or standard input), ";
      cerr << "and one output" << endl;
      exit(1);
   }

   midifile.linkNotePairs();
   vector<MidiEvent*> notes;
   notes.reserve(123456);
   int track, event;
   for (track=0; track<midifile.getNumTracks(); track++) {
      for (event=0; event<midifile.getNumEvents(track); event++) {
         if (midifile[track][event].isNoteOn()) {
            if (midifile[track][event].isLinked()) {
               notes.push_back(&midifile[track][event]);
            }
         }
      }
   }

   if (reverseQ) {
      reverseNotes(notes);
   } else {
      randomizeNotes(notes);
   }

   if (options.getArgCount() == 2) {
      midifile.write(options.getArg(2));
   } else {
      midifile.write(options.getArg(1));
   }

   return 0;
}